

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsSREF::to_str(gdsSREF *this)

{
  ostream *poVar1;
  void *pvVar2;
  gdsSREF *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GDS REF class:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Name: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  reflection: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->reflection & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  angle: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->angle);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  scale: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->scale);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  xCor: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->xCor);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  yCor: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->yCor);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void gdsSREF::to_str()
{
  cout << "GDS REF class:" << endl;

  cout << "  Name: " << this->name << endl;
  cout << "  reflection: " << this->reflection << endl;
  cout << "  angle: " << this->angle << endl;
  cout << "  scale: " << this->scale << endl;
  cout << "  xCor: " << this->xCor << endl;
  cout << "  yCor: " << this->yCor << endl;
}